

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O0

GLvoid __thiscall glcts::anon_unknown_0::GatherBase::CreateTextureCubeInt(GatherBase *this)

{
  GLenum target;
  int internalformat;
  GLenum type;
  long lVar1;
  reference pixels_00;
  int local_ec;
  undefined1 local_e8 [4];
  int j_2;
  IVec4 data [4];
  int local_a0;
  int j_1;
  allocator<tcu::Vector<int,_4>_> local_89;
  Vector<int,_4> local_88;
  undefined1 local_78 [8];
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> pixels;
  int j;
  int i;
  GLenum faces [6];
  int local_1c;
  GLenum tex_type;
  GLint size;
  GLint csize;
  GLenum internal_format;
  GatherBase *this_local;
  
  internalformat = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x21])()
  ;
  local_1c = 0x20;
  (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x17])(faces + 4);
  lVar1 = std::__cxx11::string::find((char)faces + '\x10',0x75);
  type = 0x1404;
  if (lVar1 != -1) {
    type = 0x1405;
  }
  std::__cxx11::string::~string((string *)(faces + 4));
  _j = 0x851600008515;
  faces[0] = 0x8517;
  faces[1] = 0x8518;
  faces[2] = 0x8519;
  faces[3] = 0x851a;
  glu::CallLogWrapper::glGenTextures
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
             &this->tex);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8513,
             this->tex);
  pixels.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  for (; 0 < local_1c; local_1c = local_1c / 2) {
    for (pixels.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        (int)pixels.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage < 6;
        pixels.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
             (int)pixels.
                  super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
      glu::CallLogWrapper::glTexImage2D
                (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
                 (&j)[(int)pixels.
                           super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage],
                 pixels.
                 super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,internalformat,local_1c,
                 local_1c,0,0x8d99,type,(void *)0x0);
    }
    pixels.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         pixels.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  }
  tcu::Vector<int,_4>::Vector(&local_88,999);
  std::allocator<tcu::Vector<int,_4>_>::allocator(&local_89);
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_78,0x400,
             &local_88,&local_89);
  std::allocator<tcu::Vector<int,_4>_>::~allocator(&local_89);
  for (local_a0 = 0; local_a0 < 6; local_a0 = local_a0 + 1) {
    target = (&j)[local_a0];
    pixels_00 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                          ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                           local_78,0);
    glu::CallLogWrapper::glTexSubImage2D
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,target,0
               ,0,0,0x20,0x20,0x8d99,type,pixels_00);
  }
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)local_e8,0xc,0xd,0xe,0xf);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(data[0].m_data + 2),8,9,10,0xb);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(data[1].m_data + 2),0,1,2,3);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(data[2].m_data + 2),4,5,6,7);
  for (local_ec = 0; local_ec < 6; local_ec = local_ec + 1) {
    glu::CallLogWrapper::glTexSubImage2D
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               (&j)[local_ec],0,0x16,0x19,2,2,0x8d99,type,local_e8);
    glu::CallLogWrapper::glTexSubImage2D
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               (&j)[local_ec],0,0x10,10,1,1,0x8d99,type,local_e8);
    glu::CallLogWrapper::glTexSubImage2D
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               (&j)[local_ec],0,0xb,2,1,1,0x8d99,type,data[0].m_data + 2);
    glu::CallLogWrapper::glTexSubImage2D
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               (&j)[local_ec],0,0x18,0xd,1,1,0x8d99,type,data[1].m_data + 2);
    glu::CallLogWrapper::glTexSubImage2D
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               (&j)[local_ec],0,9,0xe,1,1,0x8d99,type,data[2].m_data + 2);
  }
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8513,
             0x2802,0x812f);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8513,
             0x2803,0x812f);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8513,
             0x8072,0x812f);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8513,
             0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8513,
             0x2800,0x2600);
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~vector
            ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_78);
  return;
}

Assistant:

virtual GLvoid CreateTextureCubeInt()
	{
		GLenum		internal_format = InternalFormat();
		const GLint csize			= 32;
		GLint		size			= csize;
		GLenum		tex_type		= Type().find('u') != std::string::npos ? GL_UNSIGNED_INT : GL_INT;

		const GLenum faces[6] = { GL_TEXTURE_CUBE_MAP_POSITIVE_X, GL_TEXTURE_CUBE_MAP_NEGATIVE_X,
								  GL_TEXTURE_CUBE_MAP_POSITIVE_Y, GL_TEXTURE_CUBE_MAP_NEGATIVE_Y,
								  GL_TEXTURE_CUBE_MAP_POSITIVE_Z, GL_TEXTURE_CUBE_MAP_NEGATIVE_Z };

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		for (int i = 0; size > 0; ++i, size /= 2)
		{
			for (int j = 0; j < 6; ++j)
			{
				glTexImage2D(faces[j], i, internal_format, size, size, 0, GL_RGBA_INTEGER, tex_type, 0);
			}
		}
		std::vector<IVec4> pixels(csize * csize, IVec4(999));
		for (int j = 0; j < 6; ++j)
		{
			glTexSubImage2D(faces[j], 0, 0, 0, csize, csize, GL_RGBA_INTEGER, tex_type, &pixels[0]);
		}

		IVec4 data[4] = { IVec4(12, 13, 14, 15), IVec4(8, 9, 10, 11), IVec4(0, 1, 2, 3), IVec4(4, 5, 6, 7) };

		for (int j = 0; j < 6; ++j)
		{
			glTexSubImage2D(faces[j], 0, 22, 25, 2, 2, GL_RGBA_INTEGER, tex_type, data);
			glTexSubImage2D(faces[j], 0, 16, 10, 1, 1, GL_RGBA_INTEGER, tex_type, data + 0);
			glTexSubImage2D(faces[j], 0, 11, 2, 1, 1, GL_RGBA_INTEGER, tex_type, data + 1);
			glTexSubImage2D(faces[j], 0, 24, 13, 1, 1, GL_RGBA_INTEGER, tex_type, data + 2);
			glTexSubImage2D(faces[j], 0, 9, 14, 1, 1, GL_RGBA_INTEGER, tex_type, data + 3);
		}

		glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	}